

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# musashi_softfloat.c
# Opt level: O2

int32 float64_to_int32_round_to_zero(float64 a)

{
  uint uVar1;
  byte bVar2;
  int32 iVar3;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  ushort uVar7;
  uint uVar8;
  byte bVar9;
  ulong uVar10;
  
  uVar4 = a & 0xfffffffffffff;
  uVar1 = (uint)(a >> 0x20);
  uVar8 = uVar1 >> 0x14 & 0x7ff;
  bVar2 = (byte)(a >> 0x38);
  uVar7 = (ushort)uVar8;
  if (uVar7 < 0x41f) {
    if (uVar7 < 0x3ff) {
      iVar3 = 0;
      if (uVar4 == 0 && uVar7 == 0) {
        return 0;
      }
    }
    else {
      bVar6 = 0x33 - (char)uVar8;
      uVar10 = uVar4 + 0x10000000000000 >> (bVar6 & 0x3f);
      uVar5 = (ulong)(uint)-(int)uVar10;
      if (-1 < (long)a) {
        uVar5 = uVar10 & 0xffffffff;
      }
      iVar3 = (int32)uVar5;
      bVar9 = bVar2 >> 7;
      if ((int)(uVar5 >> 0x1f) != -((int)uVar1 >> 0x1f)) goto LAB_00336658;
      if (uVar10 << (bVar6 & 0x3f) == uVar4 + 0x10000000000000) {
        return iVar3;
      }
    }
    float_exception_flags = float_exception_flags | 0x20;
    return iVar3;
  }
  bVar9 = 0;
  if (uVar7 != 0x7ff) {
    bVar9 = bVar2 >> 7;
  }
  if (uVar4 == 0) {
    bVar9 = bVar2 >> 7;
  }
LAB_00336658:
  float_exception_flags = float_exception_flags | 1;
  return -0x80000000 - (uint)(bVar9 == 0);
}

Assistant:

int32 float64_to_int32_round_to_zero( float64 a )
{
	flag aSign;
	int16 aExp, shiftCount;
	bits64 aSig, savedASig;
	int32 z;

	aSig = extractFloat64Frac( a );
	aExp = extractFloat64Exp( a );
	aSign = extractFloat64Sign( a );
	if ( 0x41E < aExp ) {
		if ( ( aExp == 0x7FF ) && aSig ) aSign = 0;
		goto invalid;
	}
	else if ( aExp < 0x3FF ) {
		if ( aExp || aSig ) float_exception_flags |= float_flag_inexact;
		return 0;
	}
	aSig |= LIT64( 0x0010000000000000 );
	shiftCount = 0x433 - aExp;
	savedASig = aSig;
	aSig >>= shiftCount;
	z = aSig;
	if ( aSign ) z = - z;
	if ( ( z < 0 ) ^ aSign ) {
	invalid:
		float_raise( float_flag_invalid );
		return aSign ? (sbits32) 0x80000000 : 0x7FFFFFFF;
	}
	if ( ( aSig<<shiftCount ) != savedASig ) {
		float_exception_flags |= float_flag_inexact;
	}
	return z;

}